

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

bool transcode_utf8(string *utf8_val,string *result,encoding_e encoding,char unknown)

{
  char cVar1;
  int iVar2;
  QUtil *pQVar3;
  iterator iVar4;
  undefined7 in_register_00000009;
  _Base_ptr p_Var5;
  unsigned_long uval;
  unsigned_long uval_00;
  bool bVar6;
  ulong uVar7;
  bool error;
  char ch;
  int local_68;
  uint local_64;
  ulong local_60;
  size_t pos;
  string local_50;
  
  result->_M_string_length = 0;
  *(result->_M_dataplus)._M_p = '\0';
  uVar7 = utf8_val->_M_string_length;
  bVar6 = true;
  local_64 = (uint)CONCAT71(in_register_00000009,unknown);
  local_68 = (int)unknown;
  local_60 = uVar7;
  if (encoding == e_pdfdoc) {
    if ((3 < uVar7) && (*(utf8_val->_M_dataplus)._M_p == -0x3d)) {
      if ((transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)::
           fe_ff_abi_cxx11_ == '\0') &&
         (iVar2 = __cxa_guard_acquire(&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                                       ::fe_ff_abi_cxx11_), iVar2 != 0)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   &transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                    ::fe_ff_abi_cxx11_,anon_var_dwarf_784bd3,(allocator<char> *)&local_50);
        __cxa_atexit(std::__cxx11::string::~string,
                     &transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                      ::fe_ff_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                             ::fe_ff_abi_cxx11_);
        uVar7 = local_60;
      }
      if ((transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)::
           ff_fe_abi_cxx11_ == '\0') &&
         (iVar2 = __cxa_guard_acquire(&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                                       ::ff_fe_abi_cxx11_), iVar2 != 0)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   &transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                    ::ff_fe_abi_cxx11_,anon_var_dwarf_78512d,(allocator<char> *)&local_50);
        __cxa_atexit(std::__cxx11::string::~string,
                     &transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                      ::ff_fe_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                             ::ff_fe_abi_cxx11_);
        uVar7 = local_60;
      }
      if ((transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)::
           ef_bb_bf_abi_cxx11_ == '\0') &&
         (iVar2 = __cxa_guard_acquire(&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                                       ::ef_bb_bf_abi_cxx11_), iVar2 != 0)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   &transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                    ::ef_bb_bf_abi_cxx11_,anon_var_dwarf_785139,(allocator<char> *)&local_50);
        __cxa_atexit(std::__cxx11::string::~string,
                     &transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                      ::ef_bb_bf_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                             ::ef_bb_bf_abi_cxx11_);
        uVar7 = local_60;
      }
      bVar6 = true;
      iVar2 = std::__cxx11::string::compare((ulong)utf8_val,1,(string *)0x3);
      if (((iVar2 == 0) ||
          (iVar2 = std::__cxx11::string::compare((ulong)utf8_val,1,(string *)0x3), iVar2 == 0)) ||
         (iVar2 = std::__cxx11::string::compare((ulong)utf8_val,1,(string *)0x5), iVar2 == 0)) {
        std::__cxx11::string::push_back((char)result);
        bVar6 = false;
      }
    }
  }
  else if (encoding == e_utf16) {
    std::__cxx11::string::append((char *)result);
  }
  pos = 0;
  local_64 = local_64 & 0xff;
LAB_001f5c33:
  do {
    while( true ) {
      if (uVar7 <= pos) {
        return bVar6;
      }
      error = false;
      pQVar3 = (QUtil *)QUtil::get_next_utf8_codepoint(utf8_val,&pos,&error);
      if (error != true) break;
      if (encoding == e_utf16) {
        std::__cxx11::string::append((char *)result);
      }
      else {
LAB_001f5c62:
        std::__cxx11::string::append((ulong)result,'\x01');
      }
      bVar6 = false;
    }
    if (pQVar3 < (QUtil *)0x80) {
      ch = (char)pQVar3;
      if (encoding == e_pdfdoc) {
        if (pQVar3 == (QUtil *)0x7f || ((uint)pQVar3 & 0x78) == 0x18) goto LAB_001f5c62;
      }
      else if (encoding == e_utf16) {
        pQVar3 = (QUtil *)QIntC::IntConverter<char,_unsigned_long,_true,_false>::convert(&ch);
        QUtil::toUTF16_abi_cxx11_(&local_50,pQVar3,uval_00);
        std::__cxx11::string::append((string *)result);
        goto LAB_001f5d32;
      }
    }
    else {
      if (encoding == e_utf16) {
        QUtil::toUTF16_abi_cxx11_(&local_50,pQVar3,uval);
        std::__cxx11::string::append((string *)result);
LAB_001f5d32:
        std::__cxx11::string::~string((string *)&local_50);
        uVar7 = local_60;
        goto LAB_001f5c33;
      }
      if (pQVar3 == (QUtil *)0xad && encoding == e_pdfdoc) goto LAB_001f5c62;
      if (pQVar3 + -0xa1 < (QUtil *)0x5f) {
        if (encoding != e_pdfdoc) {
          if (encoding == e_macroman) goto LAB_001f5d8d;
          if (encoding != e_winansi) goto LAB_001f5da7;
        }
        goto LAB_001f5de3;
      }
      if (encoding == e_macroman) {
LAB_001f5d8d:
        local_50._M_dataplus._M_p = (pointer)pQVar3;
        iVar4 = std::
                _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                ::find(&unicode_to_mac_roman._M_t,(key_type_conflict *)&local_50);
        p_Var5 = &unicode_to_mac_roman._M_t._M_impl.super__Rb_tree_header._M_header;
LAB_001f5dc4:
        if (iVar4._M_node == p_Var5) goto LAB_001f5dce;
        cVar1 = *(char *)&iVar4._M_node[1]._M_parent;
      }
      else {
        if (encoding == e_winansi) {
          local_50._M_dataplus._M_p = (pointer)pQVar3;
          iVar4 = std::
                  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                  ::find(&unicode_to_win_ansi._M_t,(key_type_conflict *)&local_50);
          p_Var5 = &unicode_to_win_ansi._M_t._M_impl.super__Rb_tree_header._M_header;
          goto LAB_001f5dc4;
        }
LAB_001f5da7:
        if (encoding == e_pdfdoc) {
          local_50._M_dataplus._M_p = (pointer)pQVar3;
          iVar4 = std::
                  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                  ::find(&unicode_to_pdf_doc._M_t,(key_type_conflict *)&local_50);
          p_Var5 = &unicode_to_pdf_doc._M_t._M_impl.super__Rb_tree_header._M_header;
          goto LAB_001f5dc4;
        }
LAB_001f5dce:
        cVar1 = '\0';
      }
      bVar6 = (bool)(bVar6 & cVar1 != '\0');
    }
LAB_001f5de3:
    std::__cxx11::string::append((ulong)result,'\x01');
  } while( true );
}

Assistant:

static bool
transcode_utf8(std::string const& utf8_val, std::string& result, encoding_e encoding, char unknown)
{
    bool okay = true;
    result.clear();
    size_t len = utf8_val.length();
    switch (encoding) {
    case e_utf16:
        result += "\xfe\xff";
        break;
    case e_pdfdoc:
        // We need to avoid having the result start with something that will be interpreted as
        // UTF-16 or UTF-8, meaning we can't end up with a string that starts with "fe ff",
        // (UTF-16-BE) "ff fe" (UTF-16-LE, not officially part of the PDF spec, but recognized by
        // most readers including qpdf), or "ef bb bf" (UTF-8). It's more efficient to check the
        // input string to see if it will map to one of those sequences than to check the output
        // string since all cases start with the same starting character.
        if ((len >= 4) && (utf8_val[0] == '\xc3')) {
            static std::string fe_ff("\xbe\xc3\xbf");
            static std::string ff_fe("\xbf\xc3\xbe");
            static std::string ef_bb_bf("\xaf\xc2\xbb\xc2\xbf");
            // C++-20 has starts_with, but when this was written, qpdf had a minimum supported
            // version of C++-17.
            if ((utf8_val.compare(1, 3, fe_ff) == 0) || (utf8_val.compare(1, 3, ff_fe) == 0) ||
                (utf8_val.compare(1, 5, ef_bb_bf) == 0)) {
                result += unknown;
                okay = false;
            }
        }
        break;
    default:
        break;
    }
    size_t pos = 0;
    while (pos < len) {
        bool error = false;
        unsigned long codepoint = QUtil::get_next_utf8_codepoint(utf8_val, pos, error);
        if (error) {
            okay = false;
            if (encoding == e_utf16) {
                result += "\xff\xfd";
            } else {
                result.append(1, unknown);
            }
        } else if (codepoint < 128) {
            char ch = static_cast<char>(codepoint);
            if (encoding == e_utf16) {
                result += QUtil::toUTF16(QIntC::to_ulong(ch));
            } else if ((encoding == e_pdfdoc) && (((ch >= 0x18) && (ch <= 0x1f)) || (ch == 127))) {
                // PDFDocEncoding maps some low characters to Unicode, so if we encounter those
                // invalid UTF-8 code points, map them to unknown so reversing the mapping doesn't
                // change them into other characters.
                okay = false;
                result.append(1, unknown);
            } else {
                result.append(1, ch);
            }
        } else if (encoding == e_utf16) {
            result += QUtil::toUTF16(codepoint);
        } else if ((codepoint == 0xad) && (encoding == e_pdfdoc)) {
            // PDFDocEncoding omits 0x00ad (soft hyphen).
            okay = false;
            result.append(1, unknown);
        } else if (
            (codepoint > 160) && (codepoint < 256) &&
            ((encoding == e_winansi) || (encoding == e_pdfdoc))) {
            result.append(1, static_cast<char>(codepoint & 0xff));
        } else {
            unsigned char ch = '\0';
            if (encoding == e_winansi) {
                ch = encode_winansi(codepoint);
            } else if (encoding == e_macroman) {
                ch = encode_macroman(codepoint);
            } else if (encoding == e_pdfdoc) {
                ch = encode_pdfdoc(codepoint);
            }
            if (ch == '\0') {
                okay = false;
                ch = static_cast<unsigned char>(unknown);
            }
            result.append(1, static_cast<char>(ch));
        }
    }
    return okay;
}